

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

t_int * osc_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  long lVar3;
  float *pfVar4;
  double dVar5;
  double dVar6;
  double dStack_68;
  float conv;
  tabfudge tf;
  double dStack_58;
  int normhipart;
  double dphase;
  t_float frac;
  t_float f2;
  t_float f1;
  float *addr;
  float *tab;
  float *pfStack_28;
  int n;
  t_sample *out;
  t_sample *in;
  t_osc *x;
  t_int *w_local;
  
  pfVar4 = cos_table;
  lVar3 = w[1];
  out = (t_sample *)w[2];
  tab._4_4_ = (int)w[4];
  dVar6 = *(double *)(lVar3 + 0x30) + 1572864.0;
  fVar1 = *(float *)(lVar3 + 0x38);
  dVar5 = (double)(*out * fVar1) + dVar6;
  pfStack_28 = (float *)w[3];
  while (dStack_58 = dVar5, out = out + 1,
        _f2 = pfVar4 + (int)((uint)((ulong)dVar6 >> 0x20) & 0x1ff),
        dphase._4_4_ = (float)((double)CONCAT44(0x41380000,SUB84(dVar6,0)) - 1572864.0),
        tab._4_4_ = tab._4_4_ + -1, tab._4_4_ != 0) {
    fVar2 = *out;
    *pfStack_28 = dphase._4_4_ * (_f2[1] - *_f2) + *_f2;
    dVar5 = (double)(fVar2 * fVar1) + dStack_58;
    pfStack_28 = pfStack_28 + 1;
    dVar6 = dStack_58;
  }
  *pfStack_28 = dphase._4_4_ * (_f2[1] - *_f2) + *_f2;
  dStack_68 = (double)CONCAT44(0x41c80000,SUB84(dStack_58 + 803733504.0,0));
  *(double *)(lVar3 + 0x30) = dStack_68 - 805306368.0;
  return w + 5;
}

Assistant:

static t_int *osc_perform(t_int *w)
{
    t_osc *x = (t_osc *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    float *tab = cos_table, *addr;
    t_float f1, f2, frac;
    double dphase = x->x_phase + UNITBIT32;
    int normhipart;
    union tabfudge tf;
    float conv = x->x_conv;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];
#if 0
    while (n--)
    {
        tf.tf_d = dphase;
        dphase += *in++ * conv;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
        f1 = addr[0];
        f2 = addr[1];
        *out++ = f1 + frac * (f2 - f1);
    }
#endif
#if 1
        tf.tf_d = dphase;
        dphase += *in++ * conv;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
    while (--n)
    {
        tf.tf_d = dphase;
            f1 = addr[0];
        dphase += *in++ * conv;
            f2 = addr[1];
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
            *out++ = f1 + frac * (f2 - f1);
        frac = tf.tf_d - UNITBIT32;
    }
            f1 = addr[0];
            f2 = addr[1];
            *out++ = f1 + frac * (f2 - f1);
#endif

    tf.tf_d = UNITBIT32 * COSTABSIZE;
    normhipart = tf.tf_i[HIOFFSET];
    tf.tf_d = dphase + (UNITBIT32 * COSTABSIZE - UNITBIT32);
    tf.tf_i[HIOFFSET] = normhipart;
    x->x_phase = tf.tf_d - UNITBIT32 * COSTABSIZE;
    return (w+5);
}